

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_run_end(XmlReporter *this,TestRunStats *p)

{
  XmlWriter *this_00;
  long in_RSI;
  long in_RDI;
  uint *in_stack_00000010;
  string *in_stack_00000018;
  XmlWriter *in_stack_00000020;
  string *in_stack_fffffffffffffe48;
  XmlWriter *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  allocator *paVar1;
  ScopedElement *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe70;
  XmlWriter *in_stack_fffffffffffffe78;
  XmlWriter *in_stack_fffffffffffffe80;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  int local_f0;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x80) != 0) {
    XmlWriter::endElement(in_stack_fffffffffffffe80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"OverallResultsAsserts",&local_39);
  XmlWriter::scopedElement(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"successes",&local_71);
  local_78 = *(int *)(local_10 + 0x10) - *(int *)(local_10 + 0x14);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"failures",&local_99);
  XmlWriter::ScopedElement::writeAttribute<int>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_00 = (XmlWriter *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"OverallResultsTestCases",&local_c1);
  XmlWriter::startElement(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  paVar1 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"successes",paVar1);
  local_f0 = *(int *)(local_10 + 4) - *(int *)(local_10 + 0xc);
  XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  paVar1 = &local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"failures",paVar1);
  XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x84) & 1) == 0) {
    paVar1 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"skipped",paVar1);
    XmlWriter::writeAttribute<unsigned_int>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(tc) // the TestSuite tag - only if there has been at least 1 test case
                xml.endElement();

            xml.scopedElement("OverallResultsAsserts")
                    .writeAttribute("successes", p.numAsserts - p.numAssertsFailed)
                    .writeAttribute("failures", p.numAssertsFailed);

            xml.startElement("OverallResultsTestCases")
                    .writeAttribute("successes",
                                    p.numTestCasesPassingFilters - p.numTestCasesFailed)
                    .writeAttribute("failures", p.numTestCasesFailed);
            if(opt.no_skipped_summary == false)
                xml.writeAttribute("skipped", p.numTestCases - p.numTestCasesPassingFilters);
            xml.endElement();

            xml.endElement();
        }